

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeId.cpp
# Opt level: O3

void typeIdDifferentTest_invoker(void)

{
  undefined8 uVar1;
  ios_base *this;
  string local_288;
  undefined7 uStack_287;
  undefined1 local_278 [16];
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  ostringstream local_218 [112];
  ios_base local_1a8 [264];
  undefined1 *local_a0;
  long local_98;
  undefined1 local_90 [16];
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/typeId.cpp"
  ;
  local_220 = "";
  memset(local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_218);
  local_98 = 0;
  local_90[0] = 0;
  local_288 = (string)0x22;
  local_a0 = local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"typeIdDifferentTest",0x13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a0,&local_288);
  if ((undefined1 *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((undefined1 *)CONCAT71(uStack_287,local_288));
  }
  local_40 = local_a0;
  local_38 = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_228,0x33);
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  std::__cxx11::ostringstream::~ostringstream(local_218);
  std::ios_base::~ios_base(local_1a8);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/typeId.cpp"
  ;
  local_230 = "";
  memset(local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_218);
  local_98 = 0;
  local_90[0] = 0;
  local_288 = (string)0x22;
  local_a0 = local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"typeIdDifferentTest",0x13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a0,&local_288);
  if ((undefined1 *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((undefined1 *)CONCAT71(uStack_287,local_288));
  }
  local_50 = local_a0;
  local_48 = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_238,0x33);
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  std::__cxx11::ostringstream::~ostringstream(local_218);
  std::ios_base::~ios_base(local_1a8);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/typeId.cpp"
  ;
  local_240 = "";
  memset(local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_218);
  local_98 = 0;
  local_90[0] = 0;
  local_288 = (string)0x22;
  local_a0 = local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"typeIdDifferentTest",0x13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a0,&local_288);
  if ((undefined1 *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((undefined1 *)CONCAT71(uStack_287,local_288));
  }
  local_60 = local_a0;
  local_58 = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_248,0x33);
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  std::__cxx11::ostringstream::~ostringstream(local_218);
  this = local_1a8;
  std::ios_base::~ios_base(this);
  typeIdDifferentTest::test_method((typeIdDifferentTest *)this);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/typeId.cpp"
  ;
  local_250 = "";
  memset(local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_218);
  local_98 = 0;
  local_90[0] = 0;
  local_288 = (string)0x22;
  local_a0 = local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"typeIdDifferentTest",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a0,&local_288);
  if ((undefined1 *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((undefined1 *)CONCAT71(uStack_287,local_288));
  }
  local_70 = local_a0;
  local_68 = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_258,0x33);
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  std::__cxx11::ostringstream::~ostringstream(local_218);
  std::ios_base::~ios_base(local_1a8);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/typeId.cpp"
  ;
  local_260 = "";
  memset(local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_218);
  local_98 = 0;
  local_90[0] = 0;
  local_288 = (string)0x22;
  local_a0 = local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"typeIdDifferentTest",0x13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a0,&local_288);
  if ((undefined1 *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((undefined1 *)CONCAT71(uStack_287,local_288));
  }
  local_80 = local_a0;
  local_78 = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_268,0x33);
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  std::__cxx11::ostringstream::~ostringstream(local_218);
  std::ios_base::~ios_base(local_1a8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(typeIdDifferentTest)
{
  std::vector<mnf::Manifold*> manifolds;

  manifolds.push_back(new RealSpace(5));
  manifolds.push_back(new S2());
  manifolds.push_back(new SO3<ExpMapMatrix>(5));
  manifolds.push_back(new SO3<ExpMapQuaternion>(5));

  for (size_t i = 0; i < manifolds.size(); ++i)
  {
    for (size_t j = i + 1; j < manifolds.size(); ++j)
    {
      BOOST_CHECK(manifolds[i]->getTypeId() != manifolds[j]->getTypeId());
    }
  }

  for (size_t i = 0; i < manifolds.size(); ++i)
  {
    delete manifolds[i];
  }
}